

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.h
# Opt level: O2

void __thiscall Client::resultChecks(Client *this,Result *result)

{
  _Head_base<0UL,_httplib::Response_*,_false> _Var1;
  Error in_EDX;
  allocator<char> local_119;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  _Var1._M_head_impl =
       (result->res_)._M_t.
       super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>._M_t.
       super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>.
       super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl;
  httplib::to_string_abi_cxx11_(&local_38,(httplib *)(ulong)result->err_,in_EDX);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"File: ",&local_119);
  std::operator+(&local_d8,&local_f8,
                 "/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/src/reddit/Client.h"
                );
  std::operator+(&local_b8,&local_d8,", Func: ");
  std::operator+(&local_98,&local_b8,"resultChecks");
  std::operator+(&local_78,&local_98,", Line: ");
  std::__cxx11::to_string(&local_118,0x50);
  std::operator+(&local_58,&local_78,&local_118);
  check<char_const(&)[14],std::__cxx11::string,char_const(&)[2],std::__cxx11::string>
            (_Var1._M_head_impl != (Response *)0x0,(char (*) [14])"Error state: ",&local_38,
             (char (*) [2])0x161c59,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_38);
  _Var1._M_head_impl =
       (result->res_)._M_t.
       super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>._M_t.
       super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>.
       super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl;
  check<std::__cxx11::string_const&>
            ((_Var1._M_head_impl)->status == 200,&(_Var1._M_head_impl)->reason);
  check_rateLimit(this,result);
  return;
}

Assistant:

void resultChecks(const httplib::Result& result) {
        check(result, "Error state: ", httplib::to_string(result.error()), "\n", STD_HERE);
        check(result->status == 200, result->reason);
        check_rateLimit(result);
    }